

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::copyTexImage2D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int height,int border)

{
  uint uVar1;
  pointer pTVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  int iVar4;
  CubeFace face;
  int iVar5;
  Texture2D *this_00;
  int xo;
  int iVar6;
  TextureCube *this_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  TextureFormat storageFmt;
  MultisampleConstPixelBufferAccess src;
  PixelBufferAccess dst;
  
  iVar4 = this->m_activeTexture;
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  storageFmt.order = CHANNELORDER_LAST;
  storageFmt.type = CHANNELTYPE_LAST;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&dst,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&src,(MultisamplePixelBufferAccess *)&dst);
  if ((border != 0) || ((width | level | height) < 0)) goto LAB_006f0866;
  if ((src.m_access.m_size.m_data[0] == 0) ||
     ((src.m_access.m_size.m_data[1] == 0 || (src.m_access.m_size.m_data[2] == 0))))
  goto LAB_006f0bb8;
  storageFmt = mapInternalFormat(internalFormat);
  if (storageFmt.order != CHANNELORDER_LAST && storageFmt.type != CHANNELTYPE_LAST) {
    if (target == 0xde1) {
      uVar1 = (this->m_limits).maxTexture2DSize;
      if (width <= (int)uVar1 && height <= (int)uVar1) {
        if (uVar1 == 0) {
          uVar3 = 0x20;
        }
        else {
          uVar3 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = uVar3 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar3)) {
          this_00 = &pTVar2[iVar4].default2DTex;
          if (pTVar2[iVar4].tex2DBinding != (Texture2D *)0x0) {
            this_00 = pTVar2[iVar4].tex2DBinding;
          }
          if ((this_00->super_Texture).m_immutable == true) {
            if (((uint)level < 0xe) && ((this_00->m_levels).m_data[(uint)level].m_cap != 0)) {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&dst.super_ConstPixelBufferAccess,
                         &(this_00->m_levels).m_access[(uint)level].super_ConstPixelBufferAccess);
              auVar8._0_4_ = -(uint)(storageFmt.order ==
                                    dst.super_ConstPixelBufferAccess.m_format.order);
              auVar8._4_4_ = -(uint)(storageFmt.type ==
                                    dst.super_ConstPixelBufferAccess.m_format.type);
              auVar8._8_4_ = -(uint)(width == dst.super_ConstPixelBufferAccess.m_size.m_data[0]);
              auVar8._12_4_ = -(uint)(height == dst.super_ConstPixelBufferAccess.m_size.m_data[1]);
              iVar4 = movmskps(extraout_EAX,auVar8);
              if (iVar4 == 0xf) goto LAB_006f0a6e;
            }
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x502;
            return;
          }
          rc::Texture2D::allocLevel(this_00,level,&storageFmt,width,height);
LAB_006f0a6e:
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&dst.super_ConstPixelBufferAccess,
                     &(this_00->m_levels).m_access[level].super_ConstPixelBufferAccess);
          iVar4 = 0;
          if (width < 1) {
            width = iVar4;
          }
          if (height < 1) {
            height = iVar4;
          }
          for (; iVar4 != height; iVar4 = iVar4 + 1) {
            for (iVar6 = 0; width != iVar6; iVar6 = iVar6 + 1) {
              iVar5 = x + iVar6;
              if ((((-1 < iVar5) && (iVar5 < src.m_access.m_size.m_data[1])) && (-1 < y + iVar4)) &&
                 (y + iVar4 < src.m_access.m_size.m_data[2])) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&src,
                           iVar5);
                tcu::PixelBufferAccess::setPixel
                          (&dst,(Vec4 *)&stack0xffffffffffffffc0,iVar6,iVar4,0);
              }
            }
          }
          return;
        }
      }
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x501;
      return;
    }
    if (target - 0x8515 < 6) {
      if ((width == height) && (uVar1 = (this->m_limits).maxTextureCubeSize, width <= (int)uVar1)) {
        if (uVar1 == 0) {
          uVar3 = 0x20;
        }
        else {
          uVar3 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = uVar3 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar3)) {
          this_01 = &pTVar2[iVar4].defaultCubeTex;
          if (pTVar2[iVar4].texCubeBinding != (TextureCube *)0x0) {
            this_01 = pTVar2[iVar4].texCubeBinding;
          }
          face = mapGLCubeFace(target);
          if ((this_01->super_Texture).m_immutable == true) {
            if ((uint)level < 0xe) {
              if (this_01->m_levels[face].m_data[(uint)level].m_cap != 0) {
                tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                          (&dst.super_ConstPixelBufferAccess,
                           &this_01->m_levels[face].m_access[(uint)level].
                            super_ConstPixelBufferAccess);
                auVar7._0_4_ = -(uint)(storageFmt.order ==
                                      dst.super_ConstPixelBufferAccess.m_format.order);
                auVar7._4_4_ = -(uint)(storageFmt.type ==
                                      dst.super_ConstPixelBufferAccess.m_format.type);
                auVar7._8_4_ = -(uint)(width == dst.super_ConstPixelBufferAccess.m_size.m_data[0]);
                auVar7._12_4_ = -(uint)(width == dst.super_ConstPixelBufferAccess.m_size.m_data[1]);
                iVar4 = movmskps((int)&dst,auVar7);
                if (iVar4 == 0xf) goto LAB_006f0bf7;
              }
            }
LAB_006f0bb8:
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x502;
            return;
          }
          rc::TextureCube::allocFace(this_01,level,face,&storageFmt,width,width);
LAB_006f0bf7:
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&dst.super_ConstPixelBufferAccess,
                     &this_01->m_levels[face].m_access[level].super_ConstPixelBufferAccess);
          iVar4 = 0;
          if (width < 1) {
            width = 0;
          }
          for (; iVar4 != width; iVar4 = iVar4 + 1) {
            for (iVar6 = 0; width != iVar6; iVar6 = iVar6 + 1) {
              iVar5 = x + iVar6;
              if (((-1 < iVar5) && (iVar5 < src.m_access.m_size.m_data[1])) &&
                 ((-1 < y + iVar4 && (y + iVar4 < src.m_access.m_size.m_data[2])))) {
                rr::resolveMultisamplePixel
                          ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&src,
                           iVar5);
                tcu::PixelBufferAccess::setPixel
                          (&dst,(Vec4 *)&stack0xffffffffffffffc0,iVar6,iVar4,0);
              }
            }
          }
          return;
        }
      }
LAB_006f0866:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x501;
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage2D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int height, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getFace(level, face);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}